

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

double gl4cts::Math::sign<double>(double t)

{
  double t_local;
  
  if (0.0 <= t) {
    if ((t != 0.0) || (NAN(t))) {
      t_local = 1.0;
    }
    else {
      t_local = 0.0;
    }
  }
  else {
    t_local = -1.0;
  }
  return t_local;
}

Assistant:

static T sign(T t)
{
	if (0 > t)
	{
		return -1;
	}
	else if (0 == t)
	{
		return 0;
	}
	else
	{
		return 1;
	}
}